

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddPerm2Comb(int *pPerm,int Size,int *pComb)

{
  int iVar1;
  int local_2c;
  int t;
  int nTrans;
  int j;
  int i;
  int *pComb_local;
  int Size_local;
  int *pPerm_local;
  
  local_2c = 0;
  nTrans = 0;
  do {
    if (Size <= nTrans) {
      return local_2c;
    }
    t = nTrans;
    if (nTrans != pPerm[nTrans]) {
      do {
        t = t + 1;
        if (Size <= t) break;
      } while (nTrans != pPerm[t]);
      pComb[local_2c] = nTrans << 0x10 | t;
      iVar1 = pPerm[nTrans];
      pPerm[nTrans] = pPerm[t];
      pPerm[t] = iVar1;
      local_2c = local_2c + 1;
      if (nTrans != pPerm[nTrans]) {
        __assert_fail("i == pPerm[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                      ,0x287,"int Abc_ZddPerm2Comb(int *, int, int *)");
      }
    }
    nTrans = nTrans + 1;
  } while( true );
}

Assistant:

int Abc_ZddPerm2Comb( int * pPerm, int Size, int * pComb )
{
    int i, j, nTrans = 0;
    for ( i = 0; i < Size; i++ )
        if ( i != pPerm[i] )
        {
            for ( j = i+1; j < Size; j++ )
                if ( i == pPerm[j] )
                    break;
            pComb[nTrans++] = (i << 16) | j;
            ABC_SWAP( int, pPerm[i], pPerm[j] );
            assert( i == pPerm[i] );
        }
    return nTrans;
}